

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dtypes.h
# Opt level: O3

void __thiscall ParameterInfo::~ParameterInfo(ParameterInfo *this)

{
  if (this->name != (char *)0x0) {
    operator_delete__(this->name);
  }
  if (this->dimensions != (Uint8 *)0x0) {
    operator_delete__(this->dimensions);
  }
  if (this->char_data != (char *)0x0) {
    operator_delete__(this->char_data);
  }
  if (this->int_data != (Sint16 *)0x0) {
    operator_delete__(this->int_data);
  }
  if (this->float_data != (float *)0x0) {
    operator_delete__(this->float_data);
  }
  if (this->description != (char *)0x0) {
    operator_delete__(this->description);
    return;
  }
  return;
}

Assistant:

~ParameterInfo() {
		if (name)
			delete[] name;
		if (dimensions)
			delete[] dimensions;

		if (char_data)
			delete[] char_data;
		if (int_data)
			delete[] int_data;
		if (float_data)
			delete[] float_data;

		if (description)
			delete[] description;
	}